

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O3

int LegacyOCSPCallback(SSL *ssl,void *arg)

{
  uint8_t *response;
  int iVar1;
  uint uVar2;
  void *pvVar3;
  
  iVar1 = TestConfigExDataIndex();
  pvVar3 = SSL_get_ex_data((SSL *)ssl,iVar1);
  iVar1 = SSL_is_server(ssl);
  if (iVar1 == 0) {
    uVar2 = *(byte *)((long)pvVar3 + 0x637) ^ 1;
  }
  else {
    response = *(uint8_t **)((long)pvVar3 + 0x518);
    if (((response != *(uint8_t **)((long)pvVar3 + 0x520)) &&
        (*(char *)((long)pvVar3 + 0x635) == '\x01')) &&
       (iVar1 = SSL_set_ocsp_response
                          (ssl,response,(long)*(uint8_t **)((long)pvVar3 + 0x520) - (long)response),
       iVar1 == 0)) {
      return 2;
    }
    uVar2 = 2;
    if (*(char *)((long)pvVar3 + 0x637) == '\0') {
      uVar2 = (uint)*(byte *)((long)pvVar3 + 0x636) + (uint)*(byte *)((long)pvVar3 + 0x636) * 2;
    }
  }
  return uVar2;
}

Assistant:

static int LegacyOCSPCallback(SSL *ssl, void *arg) {
  const TestConfig *config = GetTestConfig(ssl);
  if (!SSL_is_server(ssl)) {
    return !config->fail_ocsp_callback;
  }

  if (!config->ocsp_response.empty() && config->set_ocsp_in_callback &&
      !SSL_set_ocsp_response(ssl, (const uint8_t *)config->ocsp_response.data(),
                             config->ocsp_response.size())) {
    return SSL_TLSEXT_ERR_ALERT_FATAL;
  }
  if (config->fail_ocsp_callback) {
    return SSL_TLSEXT_ERR_ALERT_FATAL;
  }
  if (config->decline_ocsp_callback) {
    return SSL_TLSEXT_ERR_NOACK;
  }
  return SSL_TLSEXT_ERR_OK;
}